

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_ghost(REF_GEOM ref_geom,REF_NODE ref_node)

{
  undefined8 *puVar1;
  size_t __size;
  long lVar2;
  int iVar3;
  REF_MPI ref_mpi;
  REF_GLOB *pRVar4;
  REF_INT *pRVar5;
  REF_ADJ pRVar6;
  REF_DBL *pRVar7;
  REF_ADJ_ITEM pRVar8;
  REF_ADJ_ITEM pRVar9;
  uint uVar10;
  undefined4 *puVar11;
  undefined4 *puVar12;
  REF_INT *send_size;
  REF_INT *recv_size;
  REF_INT *recv_size_00;
  REF_INT *send_size_00;
  void *pvVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  undefined8 uVar17;
  long lVar18;
  ulong uVar19;
  char *pcVar20;
  long lVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  REF_INT local;
  REF_INT degree;
  REF_INT descr [6];
  ulong local_f0;
  REF_INT local_e4;
  ulong local_e0;
  REF_NODE local_d8;
  undefined4 *local_d0;
  void *local_c8;
  ulong local_c0;
  ulong local_b8;
  void *local_b0;
  REF_INT *local_a8;
  void *local_a0;
  void *local_98;
  REF_GEOM local_90;
  undefined1 local_88 [16];
  void *local_78;
  void *local_70;
  undefined4 *local_68;
  int local_5c;
  void *local_58;
  long local_50;
  REF_INT local_48 [5];
  REF_INT local_34;
  
  ref_mpi = ref_node->ref_mpi;
  uVar10 = ref_mpi->n;
  if ((long)(int)uVar10 < 2) {
    return 0;
  }
  __size = (long)(int)uVar10 * 4;
  puVar11 = (undefined4 *)calloc(1,__size);
  if (puVar11 == (undefined4 *)0x0) {
    pcVar20 = "malloc a_next of REF_INT NULL";
    uVar17 = 0xe6a;
    goto LAB_0015ca1a;
  }
  puVar12 = (undefined4 *)calloc(1,__size);
  if (puVar12 == (undefined4 *)0x0) {
    pcVar20 = "malloc b_next of REF_INT NULL";
    uVar17 = 0xe6b;
    goto LAB_0015ca1a;
  }
  local_90 = ref_geom;
  send_size = (REF_INT *)malloc(__size);
  auVar26 = _DAT_00210ac0;
  if (send_size == (REF_INT *)0x0) {
    pcVar20 = "malloc a_nnode of REF_INT NULL";
    uVar17 = 0xe6c;
    goto LAB_0015ca1a;
  }
  uVar19 = (ulong)uVar10 + 3;
  lVar15 = (ulong)uVar10 - 1;
  auVar31._8_4_ = (int)lVar15;
  auVar31._0_8_ = lVar15;
  auVar31._12_4_ = (int)((ulong)lVar15 >> 0x20);
  lVar15 = 0;
  local_88 = auVar31 ^ _DAT_00210ac0;
  auVar32 = _DAT_00210aa0;
  auVar27 = _DAT_00210ab0;
  do {
    auVar31 = auVar27 ^ auVar26;
    iVar14 = local_88._4_4_;
    if ((bool)(~(auVar31._4_4_ == iVar14 && local_88._0_4_ < auVar31._0_4_ || iVar14 < auVar31._4_4_
                ) & 1)) {
      *(undefined4 *)((long)send_size + lVar15) = 0;
    }
    if ((auVar31._12_4_ != local_88._12_4_ || auVar31._8_4_ <= local_88._8_4_) &&
        auVar31._12_4_ <= local_88._12_4_) {
      *(undefined4 *)((long)send_size + lVar15 + 4) = 0;
    }
    auVar31 = auVar32 ^ auVar26;
    iVar22 = auVar31._4_4_;
    if (iVar22 <= iVar14 && (iVar22 != iVar14 || auVar31._0_4_ <= local_88._0_4_)) {
      *(undefined4 *)((long)send_size + lVar15 + 8) = 0;
      *(undefined4 *)((long)send_size + lVar15 + 0xc) = 0;
    }
    lVar16 = auVar27._8_8_;
    auVar27._0_8_ = auVar27._0_8_ + 4;
    auVar27._8_8_ = lVar16 + 4;
    lVar16 = auVar32._8_8_;
    auVar32._0_8_ = auVar32._0_8_ + 4;
    auVar32._8_8_ = lVar16 + 4;
    lVar15 = lVar15 + 0x10;
  } while ((uVar19 >> 2 & 0x3fffffff) << 4 != lVar15);
  local_d8 = ref_node;
  local_d0 = puVar12;
  local_68 = puVar11;
  recv_size = (REF_INT *)malloc(__size);
  auVar26 = _DAT_00210ac0;
  if (recv_size == (REF_INT *)0x0) {
    pcVar20 = "malloc b_nnode of REF_INT NULL";
    uVar17 = 0xe6d;
    goto LAB_0015ca1a;
  }
  lVar15 = 0;
  auVar23 = _DAT_00210aa0;
  auVar28 = _DAT_00210ab0;
  do {
    auVar32 = auVar28 ^ auVar26;
    if ((bool)(~(auVar32._4_4_ == local_88._4_4_ && (int)local_88._0_4_ < auVar32._0_4_ ||
                (int)local_88._4_4_ < auVar32._4_4_) & 1)) {
      *(undefined4 *)((long)recv_size + lVar15) = 0;
    }
    if ((auVar32._12_4_ != local_88._12_4_ || auVar32._8_4_ <= (int)local_88._8_4_) &&
        auVar32._12_4_ <= (int)local_88._12_4_) {
      *(undefined4 *)((long)recv_size + lVar15 + 4) = 0;
    }
    auVar32 = auVar23 ^ auVar26;
    iVar14 = auVar32._4_4_;
    if (iVar14 <= (int)local_88._4_4_ &&
        (iVar14 != local_88._4_4_ || auVar32._0_4_ <= (int)local_88._0_4_)) {
      *(undefined4 *)((long)recv_size + lVar15 + 8) = 0;
      *(undefined4 *)((long)recv_size + lVar15 + 0xc) = 0;
    }
    lVar16 = auVar28._8_8_;
    auVar28._0_8_ = auVar28._0_8_ + 4;
    auVar28._8_8_ = lVar16 + 4;
    lVar16 = auVar23._8_8_;
    auVar23._0_8_ = auVar23._0_8_ + 4;
    auVar23._8_8_ = lVar16 + 4;
    lVar15 = lVar15 + 0x10;
  } while ((uVar19 >> 2 & 0x3fffffff) << 4 != lVar15);
  recv_size_00 = (REF_INT *)malloc(__size);
  auVar26 = _DAT_00210ac0;
  if (recv_size_00 == (REF_INT *)0x0) {
    pcVar20 = "malloc a_ngeom of REF_INT NULL";
    uVar17 = 0xe6e;
    goto LAB_0015ca1a;
  }
  lVar15 = 0;
  auVar24 = _DAT_00210aa0;
  auVar29 = _DAT_00210ab0;
  do {
    auVar32 = auVar29 ^ auVar26;
    if ((bool)(~(auVar32._4_4_ == local_88._4_4_ && (int)local_88._0_4_ < auVar32._0_4_ ||
                (int)local_88._4_4_ < auVar32._4_4_) & 1)) {
      *(undefined4 *)((long)recv_size_00 + lVar15) = 0;
    }
    if ((auVar32._12_4_ != local_88._12_4_ || auVar32._8_4_ <= (int)local_88._8_4_) &&
        auVar32._12_4_ <= (int)local_88._12_4_) {
      *(undefined4 *)((long)recv_size_00 + lVar15 + 4) = 0;
    }
    auVar32 = auVar24 ^ auVar26;
    iVar14 = auVar32._4_4_;
    if (iVar14 <= (int)local_88._4_4_ &&
        (iVar14 != local_88._4_4_ || auVar32._0_4_ <= (int)local_88._0_4_)) {
      *(undefined4 *)((long)recv_size_00 + lVar15 + 8) = 0;
      *(undefined4 *)((long)recv_size_00 + lVar15 + 0xc) = 0;
    }
    lVar16 = auVar29._8_8_;
    auVar29._0_8_ = auVar29._0_8_ + 4;
    auVar29._8_8_ = lVar16 + 4;
    lVar16 = auVar24._8_8_;
    auVar24._0_8_ = auVar24._0_8_ + 4;
    auVar24._8_8_ = lVar16 + 4;
    lVar15 = lVar15 + 0x10;
  } while ((uVar19 >> 2 & 0x3fffffff) << 4 != lVar15);
  send_size_00 = (REF_INT *)malloc(__size);
  auVar26 = _DAT_00210ac0;
  if (send_size_00 == (REF_INT *)0x0) {
    pcVar20 = "malloc b_ngeom of REF_INT NULL";
    uVar17 = 0xe6f;
    goto LAB_0015ca1a;
  }
  lVar15 = 0;
  auVar25 = _DAT_00210aa0;
  auVar30 = _DAT_00210ab0;
  do {
    auVar32 = auVar30 ^ auVar26;
    if ((bool)(~(auVar32._4_4_ == local_88._4_4_ && (int)local_88._0_4_ < auVar32._0_4_ ||
                (int)local_88._4_4_ < auVar32._4_4_) & 1)) {
      *(undefined4 *)((long)send_size_00 + lVar15) = 0;
    }
    if ((auVar32._12_4_ != local_88._12_4_ || auVar32._8_4_ <= (int)local_88._8_4_) &&
        auVar32._12_4_ <= (int)local_88._12_4_) {
      *(undefined4 *)((long)send_size_00 + lVar15 + 4) = 0;
    }
    auVar32 = auVar25 ^ auVar26;
    iVar14 = auVar32._4_4_;
    if (iVar14 <= (int)local_88._4_4_ &&
        (iVar14 != local_88._4_4_ || auVar32._0_4_ <= (int)local_88._0_4_)) {
      *(undefined4 *)((long)send_size_00 + lVar15 + 8) = 0;
      *(undefined4 *)((long)send_size_00 + lVar15 + 0xc) = 0;
    }
    lVar16 = auVar30._8_8_;
    auVar30._0_8_ = auVar30._0_8_ + 4;
    auVar30._8_8_ = lVar16 + 4;
    lVar16 = auVar25._8_8_;
    auVar25._0_8_ = auVar25._0_8_ + 4;
    auVar25._8_8_ = lVar16 + 4;
    lVar15 = lVar15 + 0x10;
  } while ((ulong)(uVar10 + 3 >> 2) << 4 != lVar15);
  iVar14 = local_d8->max;
  if (0 < (long)iVar14) {
    pRVar4 = local_d8->global;
    lVar15 = 0;
    do {
      if ((-1 < pRVar4[lVar15]) && (ref_mpi->id != local_d8->part[lVar15])) {
        send_size[local_d8->part[lVar15]] = send_size[local_d8->part[lVar15]] + 1;
      }
      lVar15 = lVar15 + 1;
    } while (iVar14 != lVar15);
  }
  uVar10 = ref_mpi_alltoall(ref_mpi,send_size,recv_size,1);
  if (uVar10 != 0) {
    pcVar20 = "alltoall nnodes";
    uVar17 = 0xe78;
    goto LAB_0015c935;
  }
  iVar14 = ref_mpi->n;
  lVar15 = (long)iVar14;
  if (lVar15 < 1) {
    uVar10 = 0;
  }
  else {
    lVar16 = 0;
    uVar10 = 0;
    do {
      uVar10 = uVar10 + send_size[lVar16];
      lVar16 = lVar16 + 1;
    } while (lVar15 != lVar16);
    if ((int)uVar10 < 0) {
      pcVar20 = "malloc a_global of REF_GLOB negative";
      uVar17 = 0xe7c;
      goto LAB_0015cb01;
    }
  }
  local_58 = malloc((ulong)uVar10 * 8);
  if (local_58 == (void *)0x0) {
    pcVar20 = "malloc a_global of REF_GLOB NULL";
    uVar17 = 0xe7c;
  }
  else {
    pvVar13 = malloc((ulong)uVar10 << 2);
    puVar11 = local_68;
    local_88._0_8_ = pvVar13;
    if (pvVar13 == (void *)0x0) {
      pcVar20 = "malloc a_part of REF_INT NULL";
      uVar17 = 0xe7d;
      goto LAB_0015ca1a;
    }
    if (iVar14 < 1) {
      uVar10 = 0;
    }
    else {
      lVar16 = 0;
      uVar10 = 0;
      do {
        uVar10 = uVar10 + recv_size[lVar16];
        lVar16 = lVar16 + 1;
      } while (lVar15 != lVar16);
      if ((int)uVar10 < 0) {
        pcVar20 = "malloc b_global of REF_GLOB negative";
        uVar17 = 0xe81;
        goto LAB_0015cb01;
      }
    }
    local_e0 = (ulong)uVar10;
    pvVar13 = malloc(local_e0 * 8);
    if (pvVar13 == (void *)0x0) {
      pcVar20 = "malloc b_global of REF_GLOB NULL";
      uVar17 = 0xe81;
      goto LAB_0015ca1a;
    }
    local_98 = pvVar13;
    local_a0 = malloc(local_e0 * 4);
    if (local_a0 == (void *)0x0) {
      pcVar20 = "malloc b_part of REF_INT NULL";
      uVar17 = 0xe82;
      goto LAB_0015ca1a;
    }
    *puVar11 = 0;
    if (1 < iVar14) {
      lVar16 = 0;
      iVar14 = 0;
      do {
        iVar14 = iVar14 + send_size[lVar16];
        puVar11[lVar16 + 1] = iVar14;
        lVar16 = lVar16 + 1;
      } while (lVar15 + -1 != lVar16);
    }
    iVar14 = local_d8->max;
    if (0 < (long)iVar14) {
      pRVar4 = local_d8->global;
      lVar15 = 0;
      do {
        if (-1 < pRVar4[lVar15]) {
          iVar22 = ref_mpi->id;
          pRVar5 = local_d8->part;
          iVar3 = pRVar5[lVar15];
          if (iVar22 != iVar3) {
            iVar3 = puVar11[iVar3];
            *(REF_GLOB *)((long)local_58 + (long)iVar3 * 8) = pRVar4[lVar15];
            *(int *)(local_88._0_8_ + (long)iVar3 * 4) = iVar22;
            puVar11[pRVar5[lVar15]] = puVar11[pRVar5[lVar15]] + 1;
          }
        }
        lVar15 = lVar15 + 1;
      } while (iVar14 != lVar15);
    }
    uVar10 = ref_mpi_alltoallv(ref_mpi,local_58,send_size,local_98,recv_size,1,2);
    if (uVar10 != 0) {
      pcVar20 = "alltoallv global";
      uVar17 = 0xe94;
LAB_0015c935:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar17
             ,"ref_geom_ghost",(ulong)uVar10,pcVar20);
      return uVar10;
    }
    uVar10 = ref_mpi_alltoallv(ref_mpi,(void *)local_88._0_8_,send_size,local_a0,recv_size,1,1);
    if (uVar10 != 0) {
      pcVar20 = "alltoallv global";
      uVar17 = 0xe97;
      goto LAB_0015c935;
    }
    if (local_e0 != 0) {
      uVar19 = 0;
      do {
        uVar10 = ref_node_local(local_d8,*(REF_GLOB *)((long)local_98 + uVar19 * 8),&local_e4);
        if (uVar10 != 0) {
          pcVar20 = "g2l";
          uVar17 = 0xe9a;
          goto LAB_0015c935;
        }
        local_a8 = (REF_INT *)(long)*(int *)((long)local_a0 + uVar19 * 4);
        uVar10 = ref_adj_degree(local_90->ref_adj,local_e4,&local_5c);
        if (uVar10 != 0) {
          pcVar20 = "deg";
          uVar17 = 0xe9c;
          goto LAB_0015c935;
        }
        send_size_00[(long)local_a8] = send_size_00[(long)local_a8] + local_5c;
        uVar19 = uVar19 + 1;
      } while (local_e0 != uVar19);
    }
    uVar10 = ref_mpi_alltoall(ref_mpi,send_size_00,recv_size_00,1);
    if (uVar10 != 0) {
      pcVar20 = "alltoall ngeoms";
      uVar17 = 0xea3;
      goto LAB_0015c935;
    }
    iVar14 = ref_mpi->n;
    lVar15 = (long)iVar14;
    if (lVar15 < 1) {
      local_c0 = 0;
    }
    else {
      lVar16 = 0;
      local_c0 = 0;
      do {
        uVar10 = (int)local_c0 + recv_size_00[lVar16];
        local_c0 = (ulong)uVar10;
        lVar16 = lVar16 + 1;
      } while (lVar15 != lVar16);
      if ((int)uVar10 < 0) {
        pcVar20 = "malloc a_descr of REF_GLOB negative";
        uVar17 = 0xea7;
        goto LAB_0015cb01;
      }
    }
    iVar22 = (int)local_c0;
    local_c8 = malloc((ulong)(uint)(iVar22 * 6) << 3);
    if (local_c8 == (void *)0x0) {
      pcVar20 = "malloc a_descr of REF_GLOB NULL";
      uVar17 = 0xea7;
    }
    else {
      local_78 = malloc((ulong)(uint)(iVar22 * 2) << 3);
      if (local_78 == (void *)0x0) {
        pcVar20 = "malloc a_param of REF_DBL NULL";
        uVar17 = 0xea8;
      }
      else {
        if (iVar14 < 1) {
          iVar22 = 0;
        }
        else {
          lVar16 = 0;
          iVar22 = 0;
          do {
            iVar22 = iVar22 + send_size_00[lVar16];
            lVar16 = lVar16 + 1;
          } while (lVar15 != lVar16);
          if (iVar22 < 0) {
            pcVar20 = "malloc b_descr of REF_GLOB negative";
            uVar17 = 0xeac;
LAB_0015cb01:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   uVar17,"ref_geom_ghost",pcVar20);
            return 1;
          }
        }
        local_b0 = malloc((ulong)(uint)(iVar22 * 6) << 3);
        if (local_b0 == (void *)0x0) {
          pcVar20 = "malloc b_descr of REF_GLOB NULL";
          uVar17 = 0xeac;
        }
        else {
          local_70 = malloc((ulong)(uint)(iVar22 * 2) << 3);
          if (local_70 != (void *)0x0) {
            *local_d0 = 0;
            if (1 < iVar14) {
              lVar16 = 0;
              iVar14 = 0;
              do {
                iVar14 = iVar14 + send_size_00[lVar16];
                local_d0[lVar16 + 1] = iVar14;
                lVar16 = lVar16 + 1;
              } while (lVar15 + -1 != lVar16);
            }
            if (local_e0 != 0) {
              local_b8 = 0;
              do {
                uVar10 = ref_node_local(local_d8,*(REF_GLOB *)((long)local_98 + local_b8 * 8),
                                        &local_e4);
                if (uVar10 != 0) {
                  pcVar20 = "g2l";
                  uVar17 = 0xeb5;
                  goto LAB_0015c935;
                }
                if (((-1 < (long)local_e4) && (pRVar6 = local_90->ref_adj, local_e4 < pRVar6->nnode)
                    ) && (lVar15 = (long)pRVar6->first[local_e4], lVar15 != -1)) {
                  local_50 = (long)*(int *)((long)local_a0 + local_b8 * 4);
                  pRVar9 = pRVar6->item + lVar15;
                  local_a8 = local_90->descr;
                  pRVar7 = local_90->param;
                  pRVar8 = local_90->ref_adj->item;
                  lVar16 = (long)(int)local_d0[local_50];
                  pvVar13 = (void *)(lVar16 * 0x30 + (long)local_b0);
                  while( true ) {
                    iVar14 = pRVar9->ref;
                    lVar21 = (long)iVar14;
                    lVar18 = 0;
                    do {
                      lVar2 = *(long *)(local_a8 + lVar21 * 6 + lVar18);
                      auVar26._8_4_ = (int)((ulong)lVar2 >> 0x20);
                      auVar26._0_8_ = lVar2;
                      auVar26._12_4_ = -(uint)(lVar2 < 0);
                      puVar1 = (undefined8 *)((long)pvVar13 + lVar18 * 8);
                      *puVar1 = CONCAT44(-(uint)((int)lVar2 < 0),(int)lVar2);
                      puVar1[1] = auVar26._8_8_;
                      lVar18 = lVar18 + 2;
                    } while (lVar18 != 6);
                    iVar22 = local_a8[lVar21 * 6 + 5];
                    lVar18 = -1;
                    if (((-1 < (long)iVar22) && (iVar22 < local_d8->max)) &&
                       (lVar18 = local_d8->global[iVar22], lVar18 < 0)) {
                      lVar18 = -1;
                    }
                    *(long *)((long)local_b0 + lVar16 * 0x30 + 0x28) = lVar18;
                    *(REF_DBL *)((long)local_70 + lVar16 * 0x10) = pRVar7[lVar21 * 2];
                    *(REF_DBL *)((long)local_70 + lVar16 * 0x10 + 8) = pRVar7[iVar14 * 2 + 1];
                    lVar16 = lVar16 + 1;
                    lVar15 = (long)pRVar8[(int)lVar15].next;
                    if (lVar15 == -1) break;
                    pRVar9 = pRVar8 + lVar15;
                    pvVar13 = (void *)((long)pvVar13 + 0x30);
                  }
                  local_d0[local_50] = (int)lVar16;
                }
                local_b8 = local_b8 + 1;
              } while (local_b8 != local_e0);
            }
            uVar10 = ref_mpi_alltoallv(ref_mpi,local_b0,send_size_00,local_c8,recv_size_00,6,2);
            if (uVar10 == 0) {
              uVar10 = ref_mpi_alltoallv(ref_mpi,local_70,send_size_00,local_78,recv_size_00,2,3);
              if (uVar10 == 0) {
                if ((int)local_c0 != 0) {
                  local_e0 = local_c0 & 0xffffffff;
                  local_f0 = 0;
                  pvVar13 = local_c8;
                  do {
                    lVar15 = 0;
                    do {
                      puVar11 = (undefined4 *)((long)pvVar13 + lVar15 * 8);
                      *(ulong *)(local_48 + lVar15) = CONCAT44(puVar11[2],*puVar11);
                      lVar15 = lVar15 + 2;
                    } while (lVar15 != 6);
                    uVar10 = ref_node_local(local_d8,*(REF_GLOB *)
                                                      ((long)local_c8 + local_f0 * 0x30 + 0x28),
                                            &local_e4);
                    if (uVar10 != 0) {
                      pcVar20 = "g2l";
                      uVar17 = 0xed0;
                      goto LAB_0015c935;
                    }
                    local_34 = local_e4;
                    uVar10 = ref_geom_add_with_descr
                                       (local_90,local_48,
                                        (REF_DBL *)(local_f0 * 0x10 + (long)local_78));
                    if (uVar10 != 0) {
                      pcVar20 = "add ghost";
                      uVar17 = 0xed3;
                      goto LAB_0015c935;
                    }
                    local_f0 = local_f0 + 1;
                    pvVar13 = (void *)((long)pvVar13 + 0x30);
                  } while (local_f0 != local_e0);
                }
                free(local_70);
                free(local_b0);
                free(local_78);
                free(local_c8);
                free(local_a0);
                free(local_98);
                free((void *)local_88._0_8_);
                free(local_58);
                free(send_size_00);
                free(recv_size_00);
                free(recv_size);
                free(send_size);
                free(local_d0);
                free(local_68);
                return 0;
              }
              pcVar20 = "alltoallv param";
              uVar17 = 0xec9;
            }
            else {
              pcVar20 = "alltoallv descr";
              uVar17 = 0xec6;
            }
            goto LAB_0015c935;
          }
          pcVar20 = "malloc b_param of REF_DBL NULL";
          uVar17 = 0xead;
          local_70 = (void *)0x0;
        }
      }
    }
  }
LAB_0015ca1a:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar17,
         "ref_geom_ghost",pcVar20);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_ghost(REF_GEOM ref_geom, REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *a_nnode, *b_nnode;
  REF_INT a_nnode_total, b_nnode_total;
  REF_GLOB *a_global, *b_global;
  REF_INT *a_part, *b_part;
  REF_INT *a_ngeom, *b_ngeom;
  REF_INT a_ngeom_total, b_ngeom_total;
  REF_GLOB *a_descr, *b_descr;
  REF_GLOB global;
  REF_DBL *a_param, *b_param;
  REF_INT part, node, degree;
  REF_INT *a_next, *b_next;
  REF_INT local, item, geom, i;
  REF_INT descr[REF_GEOM_DESCR_SIZE];

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_next, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_next, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(a_nnode, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_nnode, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(a_ngeom, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_ngeom, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      a_nnode[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_nnode, b_nnode, REF_INT_TYPE),
      "alltoall nnodes");

  a_nnode_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_nnode_total += a_nnode[part];
  ref_malloc(a_global, a_nnode_total, REF_GLOB);
  ref_malloc(a_part, a_nnode_total, REF_INT);

  b_nnode_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_nnode_total += b_nnode[part];
  ref_malloc(b_global, b_nnode_total, REF_GLOB);
  ref_malloc(b_part, b_nnode_total, REF_INT);

  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_nnode[part - 1];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      part = ref_node_part(ref_node, node);
      a_global[a_next[part]] = ref_node_global(ref_node, node);
      a_part[a_next[part]] = ref_mpi_rank(ref_mpi);
      a_next[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_global, a_nnode, b_global, b_nnode, 1,
                        REF_GLOB_TYPE),
      "alltoallv global");
  RSS(ref_mpi_alltoallv(ref_mpi, a_part, a_nnode, b_part, b_nnode, 1,
                        REF_INT_TYPE),
      "alltoallv global");

  for (node = 0; node < b_nnode_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    part = b_part[node];
    RSS(ref_adj_degree(ref_geom_adj(ref_geom), local, &degree), "deg");
    /* printf("%d: node %d global %d local %d part %d degree %d\n",
       ref_mpi_rank(ref_mpi), node,b_global[node], local, part, degree); */
    b_ngeom[part] += degree;
  }

  RSS(ref_mpi_alltoall(ref_mpi, b_ngeom, a_ngeom, REF_INT_TYPE),
      "alltoall ngeoms");

  a_ngeom_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_ngeom_total += a_ngeom[part];
  ref_malloc(a_descr, REF_GEOM_DESCR_SIZE * a_ngeom_total, REF_GLOB);
  ref_malloc(a_param, 2 * a_ngeom_total, REF_DBL);

  b_ngeom_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_ngeom_total += b_ngeom[part];
  ref_malloc(b_descr, REF_GEOM_DESCR_SIZE * b_ngeom_total, REF_GLOB);
  ref_malloc(b_param, 2 * b_ngeom_total, REF_DBL);

  b_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    b_next[part] = b_next[part - 1] + b_ngeom[part - 1];
  }

  for (node = 0; node < b_nnode_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    part = b_part[node];
    each_ref_geom_having_node(ref_geom, local, item, geom) {
      each_ref_descr(ref_geom, i) {
        b_descr[i + REF_GEOM_DESCR_SIZE * b_next[part]] =
            (REF_GLOB)ref_geom_descr(ref_geom, i, geom);
      }
      b_descr[REF_GEOM_DESCR_NODE + REF_GEOM_DESCR_SIZE * b_next[part]] =
          ref_node_global(ref_node, ref_geom_node(ref_geom, geom));
      b_param[0 + 2 * b_next[part]] = ref_geom_param(ref_geom, 0, geom);
      b_param[1 + 2 * b_next[part]] = ref_geom_param(ref_geom, 1, geom);
      b_next[part]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_descr, b_ngeom, a_descr, a_ngeom,
                        REF_GEOM_DESCR_SIZE, REF_GLOB_TYPE),
      "alltoallv descr");
  RSS(ref_mpi_alltoallv(ref_mpi, b_param, b_ngeom, a_param, a_ngeom, 2,
                        REF_DBL_TYPE),
      "alltoallv param");

  for (geom = 0; geom < a_ngeom_total; geom++) {
    each_ref_descr(ref_geom, i) {
      descr[i] = (REF_INT)a_descr[i + REF_GEOM_DESCR_SIZE * geom];
    }
    global = a_descr[REF_GEOM_DESCR_NODE + REF_GEOM_DESCR_SIZE * geom];
    RSS(ref_node_local(ref_node, global, &local), "g2l");
    descr[REF_GEOM_DESCR_NODE] = local;
    RSS(ref_geom_add_with_descr(ref_geom, descr, &(a_param[2 * geom])),
        "add ghost");
  }

  free(b_param);
  free(b_descr);
  free(a_param);
  free(a_descr);
  free(b_part);
  free(b_global);
  free(a_part);
  free(a_global);
  free(b_ngeom);
  free(a_ngeom);
  free(b_nnode);
  free(a_nnode);
  free(b_next);
  free(a_next);

  return REF_SUCCESS;
}